

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O3

void push_ss(PDISASM pMyDisasm)

{
  if ((pMyDisasm->Reserved_).Architecture == 0x40) {
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"???",4);
    (pMyDisasm->Operand1).AccessMode = 0;
    (pMyDisasm->Operand2).AccessMode = 0;
    (pMyDisasm->Operand3).AccessMode = 0;
    (pMyDisasm->Operand4).AccessMode = 0;
    (pMyDisasm->Operand5).AccessMode = 0;
    (pMyDisasm->Operand6).AccessMode = 0;
    (pMyDisasm->Operand7).AccessMode = 0;
    (pMyDisasm->Operand8).AccessMode = 0;
    (pMyDisasm->Operand9).AccessMode = 0;
    (pMyDisasm->Reserved_).ERROR_OPCODE = -1;
  }
  else {
    (pMyDisasm->Instruction).Category = 0x10001;
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"push",5);
    strcpy((pMyDisasm->Operand1).OpMnemonic,RegistersSEG[2]);
    (pMyDisasm->Operand2).OpType = 0x20000;
    (pMyDisasm->Operand2).Registers.type = 0x800;
    (pMyDisasm->Operand2).Registers.segment = REGS[2];
    (pMyDisasm->Operand2).OpSize = 0x10;
    (pMyDisasm->Operand1).OpType = 0x30000;
    (pMyDisasm->Operand1).OpSize = 0x10;
    (pMyDisasm->Operand1).Memory.BaseRegister = 0x10;
    (pMyDisasm->Instruction).ImplicitModifiedRegs.type = 1;
    (pMyDisasm->Instruction).ImplicitModifiedRegs.gpr = 0x10;
    (pMyDisasm->Reserved_).EIP_ = (pMyDisasm->Reserved_).EIP_ + 1;
  }
  return;
}

Assistant:

void __bea_callspec__ push_ss(PDISASM pMyDisasm)
{
  if (GV.Architecture == 64) {
      failDecode(pMyDisasm);
      return;
  }
  pMyDisasm->Instruction.Category = GENERAL_PURPOSE_INSTRUCTION+DATA_TRANSFER;
  #ifndef BEA_LIGHT_DISASSEMBLY
     (void) strcpy (pMyDisasm->Instruction.Mnemonic, "push");
  #endif

  #ifndef BEA_LIGHT_DISASSEMBLY
     (void) strcpy((char*) &pMyDisasm->Operand1.OpMnemonic, RegistersSEG[2]);
  #endif
  pMyDisasm->Operand2.OpType = REGISTER_TYPE;
  pMyDisasm->Operand2.Registers.type = SEGMENT_REG;
  pMyDisasm->Operand2.Registers.segment = REGS[2];
  pMyDisasm->Operand2.OpSize = 16;
  pMyDisasm->Operand1.OpType = MEMORY_TYPE;
  pMyDisasm->Operand1.OpSize = 16;
  pMyDisasm->Operand1.Memory.BaseRegister = REG4;
  pMyDisasm->Instruction.ImplicitModifiedRegs.type = GENERAL_REG;
  pMyDisasm->Instruction.ImplicitModifiedRegs.gpr = REG4;
  GV.EIP_++;
}